

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadline_timer_service.hpp
# Opt level: O0

void __thiscall
asio::detail::
deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::~deadline_timer_service
          (deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
           *this)

{
  epoll_reactor *in_RDI;
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_stack_ffffffffffffffe8;
  
  (in_RDI->super_execution_context_service_base<asio::detail::epoll_reactor>).super_service.
  _vptr_service = (_func_int **)&PTR__deadline_timer_service_003e24e8;
  epoll_reactor::
  remove_timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
            (in_RDI,in_stack_ffffffffffffffe8);
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::~timer_queue((timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                  *)in_RDI);
  execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
  ::~execution_context_service_base
            ((execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
              *)0x240d24);
  return;
}

Assistant:

~deadline_timer_service()
  {
    scheduler_.remove_timer_queue(timer_queue_);
  }